

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O1

uint32_t trico_get_number_of_triangles(void *a)

{
  if (((*(int *)((long)a + 0x24) - 3U < 2) && (*(int *)((long)a + 0x40) == 0)) &&
     ((ulong)((long)*(uint32_t **)((long)a + 0x18) + (4 - *(long *)((long)a + 0x10))) <=
      *(ulong *)((long)a + 0x30))) {
    return **(uint32_t **)((long)a + 0x18);
  }
  return 0;
}

Assistant:

uint32_t trico_get_number_of_triangles(void* a)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (arch->next_stream_type == trico_triangle_uint32_stream || arch->next_stream_type == trico_triangle_uint64_stream)
    {
    uint32_t nr_triangles;
    if (!read_inplace(&nr_triangles, sizeof(uint32_t), 1, arch))
      return 0;
    return nr_triangles;
    }
  return 0;
  }